

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O3

int __thiscall
ncnn::PriorBox::forward
          (PriorBox *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  pointer pMVar5;
  Mat *pMVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  int iVar11;
  float *pfVar12;
  int iVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  int iVar16;
  float *pfVar17;
  long lVar18;
  int iVar19;
  int k;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 in_XMM4 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  float fVar36;
  undefined1 auVar37 [16];
  float local_60;
  float local_5c;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar16 = pMVar5->w;
  uVar1 = pMVar5->h;
  iVar19 = this->image_width;
  iVar22 = this->image_height;
  if ((iVar22 == -0xe9 && iVar19 == -0xe9) &&
      (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pMVar5 == 0x40) {
    if (((this->max_sizes).data == (void *)0x0) ||
       ((long)(this->max_sizes).c * (this->max_sizes).cstep == 0)) {
      fVar27 = this->step_width;
      fVar26 = this->step_height;
      uVar2 = (this->min_sizes).w;
      uVar3 = (this->aspect_ratios).w;
      iVar22 = uVar2 + uVar3 + -1;
      pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar6,iVar16 * uVar1 * iVar22 * 4,4,opt->blob_allocator);
      pvVar7 = pMVar6->data;
      if (pvVar7 == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar6->c * pMVar6->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar1) {
        fVar25 = 1.0 / (float)iVar16;
        uVar23 = -(uint)(fVar27 == -233.0);
        fVar27 = (float)(~uVar23 & (uint)fVar27 | uVar23 & (uint)fVar25);
        uVar23 = -(uint)(fVar26 == -233.0);
        fVar28 = (float)(int)uVar1 * 0.5;
        pfVar12 = (float *)(this->min_sizes).data;
        uVar14 = 0;
        do {
          if (0 < iVar16) {
            fVar29 = ((float)(int)uVar14 + this->offset) *
                     (float)(~uVar23 & (uint)fVar26 | (uint)(1.0 / (float)(int)uVar1) & uVar23);
            fVar30 = this->offset * fVar27;
            pfVar17 = (float *)((long)pvVar7 + (long)(iVar22 * iVar16 * 4 * (int)uVar14) * 4);
            pvVar8 = (this->min_sizes).data;
            pvVar9 = (this->aspect_ratios).data;
            iVar19 = 0;
            do {
              if (0 < (int)uVar2) {
                uVar20 = 0;
                do {
                  fVar32 = *(float *)((long)pvVar8 + uVar20 * 4);
                  fVar33 = fVar28 * fVar32 * fVar25;
                  fVar32 = fVar32 * 0.5;
                  *pfVar17 = fVar30 - fVar33;
                  pfVar17[1] = fVar29 - fVar32;
                  pfVar17[2] = fVar30 + fVar33;
                  pfVar17[3] = fVar29 + fVar32;
                  pfVar17 = pfVar17 + 4;
                  uVar20 = uVar20 + 1;
                } while (uVar2 != uVar20);
              }
              if (1 < (int)uVar3) {
                fVar32 = *pfVar12;
                uVar20 = 1;
                do {
                  fVar33 = *(float *)((long)pvVar9 + uVar20 * 4);
                  auVar37 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar33));
                  fVar31 = auVar37._0_4_;
                  fVar24 = fVar33 * fVar31 * fVar31 + -3.0;
                  fVar33 = (float)(~-(uint)(ABS(fVar33) < 1.1754944e-38) &
                                  (uint)(fVar33 * fVar31 * -0.5 * fVar24)) *
                           fVar28 * fVar32 * fVar25;
                  fVar24 = fVar31 * -0.5 * fVar32 * 0.5 * fVar24;
                  *pfVar17 = fVar30 - fVar33;
                  pfVar17[1] = fVar29 - fVar24;
                  pfVar17[2] = fVar30 + fVar33;
                  pfVar17[3] = fVar29 + fVar24;
                  pfVar17 = pfVar17 + 4;
                  uVar20 = uVar20 + 1;
                } while (uVar3 != uVar20);
              }
              fVar30 = fVar30 + fVar27;
              iVar19 = iVar19 + 1;
            } while (iVar19 != iVar16);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar1);
      }
      if (this->clip == 0) {
        return 0;
      }
      iVar16 = pMVar6->w;
      if ((long)iVar16 < 1) {
        return 0;
      }
      lVar18 = 0;
      do {
        fVar27 = *(float *)((long)pvVar7 + lVar18 * 4);
        if (fVar27 <= 0.0) {
          fVar27 = 0.0;
        }
        if (1.0 <= fVar27) {
          fVar27 = 1.0;
        }
        *(float *)((long)pvVar7 + lVar18 * 4) = fVar27;
        lVar18 = lVar18 + 1;
      } while (iVar16 != lVar18);
      return 0;
    }
  }
  else if (iVar19 != -0xe9) goto LAB_0015fdf4;
  iVar19 = pMVar5[1].w;
LAB_0015fdf4:
  if (iVar22 == -0xe9) {
    iVar22 = pMVar5[1].h;
  }
  fVar27 = this->step_width;
  fVar26 = this->step_height;
  if ((fVar27 == -233.0) && (fVar27 = (float)iVar19 / (float)iVar16, this->step_mmdetection == true)
     ) {
    fVar27 = ceilf(fVar27);
  }
  if ((fVar26 == -233.0) &&
     (fVar26 = (float)iVar22 / (float)(int)uVar1, this->step_mmdetection == true)) {
    fVar26 = ceilf(fVar26);
  }
  uVar2 = (this->min_sizes).w;
  iVar4 = (this->max_sizes).w;
  uVar3 = (this->aspect_ratios).w;
  iVar13 = this->flip;
  if (this->flip != 0) {
    iVar13 = uVar3 * uVar2;
  }
  iVar13 = uVar3 * uVar2 + iVar4 + uVar2 + iVar13;
  pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create(pMVar6,iVar16 * uVar1 * iVar13 * 4,2,4,opt->blob_allocator);
  pvVar7 = pMVar6->data;
  iVar11 = -100;
  if ((pvVar7 != (void *)0x0) && ((long)pMVar6->c * pMVar6->cstep != 0)) {
    if (0 < (int)uVar1) {
      local_60 = fVar26;
      local_5c = fVar27;
      if (this->center_mmdetection != false) {
        local_60 = fVar26 + -1.0;
        local_5c = fVar27 + -1.0;
      }
      fVar32 = (float)iVar19;
      fVar33 = (float)iVar22;
      auVar37._0_8_ = CONCAT44(fVar33,fVar32);
      auVar37._8_8_ = auVar37._0_8_;
      auVar37 = rcpps(in_XMM4,auVar37);
      fVar25 = auVar37._0_4_;
      fVar28 = auVar37._4_4_;
      fVar29 = auVar37._8_4_;
      fVar30 = auVar37._12_4_;
      fVar25 = (1.0 - fVar32 * fVar25) * fVar25 + fVar25;
      fVar28 = (1.0 - fVar33 * fVar28) * fVar28 + fVar28;
      fVar29 = (1.0 - fVar32 * fVar29) * fVar29 + fVar29;
      fVar30 = (1.0 - fVar33 * fVar30) * fVar30 + fVar30;
      uVar14 = 0;
      do {
        if (0 < iVar16) {
          fVar33 = local_60 * this->offset + (float)(int)uVar14 * fVar26;
          fVar32 = this->offset * local_5c;
          pauVar15 = (undefined1 (*) [16])
                     ((long)pvVar7 + (long)(iVar13 * iVar16 * 4 * (int)uVar14) * 4);
          pvVar8 = (this->min_sizes).data;
          iVar22 = 0;
          do {
            if (0 < (int)uVar2) {
              pvVar9 = (this->max_sizes).data;
              pvVar10 = (this->aspect_ratios).data;
              iVar19 = this->flip;
              uVar20 = 0;
              do {
                fVar24 = *(float *)((long)pvVar8 + uVar20 * 4);
                fVar31 = fVar24 * 0.5;
                auVar35._0_4_ = (fVar32 - fVar31) * fVar25;
                auVar35._4_4_ = (fVar33 - fVar31) * fVar28;
                auVar35._8_4_ = (fVar31 + fVar32) * fVar29;
                auVar35._12_4_ = (fVar31 + fVar33) * fVar30;
                *pauVar15 = auVar35;
                if (iVar4 < 1) {
                  pauVar15 = pauVar15 + 1;
                }
                else {
                  fVar24 = SQRT(fVar24 * *(float *)((long)pvVar9 + uVar20 * 4)) * 0.5;
                  *(float *)pauVar15[1] = (fVar32 - fVar24) * fVar25;
                  *(float *)(pauVar15[1] + 4) = (fVar33 - fVar24) * fVar28;
                  *(float *)(pauVar15[1] + 8) = (fVar24 + fVar32) * fVar29;
                  *(float *)(pauVar15[1] + 0xc) = (fVar24 + fVar33) * fVar30;
                  pauVar15 = pauVar15 + 2;
                }
                if (0 < (int)uVar3) {
                  uVar21 = 0;
                  do {
                    fVar24 = *(float *)((long)pvVar10 + uVar21 * 4);
                    auVar37 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar24));
                    fVar34 = auVar37._0_4_;
                    fVar36 = fVar24 * fVar34 * fVar34 + -3.0;
                    fVar24 = (float)(~-(uint)(ABS(fVar24) < 1.1754944e-38) &
                                    (uint)(fVar24 * fVar34 * -0.5 * fVar36)) * fVar31;
                    fVar36 = fVar34 * -0.5 * fVar31 * fVar36;
                    *(float *)*pauVar15 = (fVar32 - fVar24) * fVar25;
                    *(float *)((long)*pauVar15 + 4) = (fVar33 - fVar36) * fVar28;
                    *(float *)((long)*pauVar15 + 8) = (fVar32 + fVar24) * fVar29;
                    *(float *)((long)*pauVar15 + 0xc) = (fVar33 + fVar36) * fVar30;
                    if (iVar19 == 0) {
                      pauVar15 = pauVar15 + 1;
                    }
                    else {
                      *(float *)pauVar15[1] = (fVar32 - fVar36) * fVar25;
                      *(float *)(pauVar15[1] + 4) = (fVar33 - fVar24) * fVar28;
                      *(float *)(pauVar15[1] + 8) = (fVar32 + fVar36) * fVar29;
                      *(float *)(pauVar15[1] + 0xc) = (fVar33 + fVar24) * fVar30;
                      pauVar15 = pauVar15 + 2;
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar3 != uVar21);
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar2);
            }
            fVar32 = fVar32 + fVar27;
            iVar22 = iVar22 + 1;
          } while (iVar22 != iVar16);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar1);
    }
    uVar1 = pMVar6->w;
    if (this->clip != 0) {
      uVar14 = 0;
      if ((int)uVar1 < 1) {
        return 0;
      }
      do {
        fVar27 = *(float *)((long)pvVar7 + uVar14 * 4);
        if (fVar27 <= 0.0) {
          fVar27 = 0.0;
        }
        if (1.0 <= fVar27) {
          fVar27 = 1.0;
        }
        *(float *)((long)pvVar7 + uVar14 * 4) = fVar27;
        uVar14 = uVar14 + 1;
      } while (uVar1 != uVar14);
    }
    uVar2 = uVar1 + 3;
    if (-1 < (int)uVar1) {
      uVar2 = uVar1;
    }
    iVar11 = 0;
    if (3 < (int)uVar1) {
      iVar16 = (int)uVar2 >> 2;
      pfVar12 = (float *)((long)pvVar7 + (ulong)uVar1 * pMVar6->elemsize);
      do {
        *pfVar12 = this->variances[0];
        pfVar12[1] = this->variances[1];
        pfVar12[2] = this->variances[2];
        pfVar12[3] = this->variances[3];
        pfVar12 = pfVar12 + 4;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
    }
  }
  return iVar11;
}

Assistant:

int PriorBox::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int w = bottom_blobs[0].w;
    int h = bottom_blobs[0].h;

    if (bottom_blobs.size() == 1 && image_width == -233 && image_height == -233 && max_sizes.empty())
    {
        // mxnet style _contrib_MultiBoxPrior
        float step_w = step_width;
        float step_h = step_height;
        if (step_w == -233)
            step_w = 1.f / (float)w;
        if (step_h == -233)
            step_h = 1.f / (float)h;

        int num_sizes = min_sizes.w;
        int num_ratios = aspect_ratios.w;

        int num_prior = num_sizes - 1 + num_ratios;

        Mat& top_blob = top_blobs[0];
        top_blob.create(4 * w * h * num_prior, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* box = (float*)top_blob + i * w * num_prior * 4;

            float center_x = offset * step_w;
            float center_y = offset * step_h + i * step_h;

            for (int j = 0; j < w; j++)
            {
                // ratio = 1, various sizes
                for (int k = 0; k < num_sizes; k++)
                {
                    float size = min_sizes[k];
                    float cw = size * h / w / 2;
                    float ch = size / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                // various ratios, size = min_size = size[0]
                float size = min_sizes[0];
                for (int p = 1; p < num_ratios; p++)
                {
                    float ratio = static_cast<float>(sqrt(aspect_ratios[p]));
                    float cw = size * h / w * ratio / 2;
                    float ch = size / ratio / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                center_x += step_w;
            }
        }

        if (clip)
        {
            float* box = top_blob;
            for (int i = 0; i < top_blob.w; i++)
            {
                box[i] = std::min(std::max(box[i], 0.f), 1.f);
            }
        }

        return 0;
    }

    int image_w = image_width;
    int image_h = image_height;
    if (image_w == -233)
        image_w = bottom_blobs[1].w;
    if (image_h == -233)
        image_h = bottom_blobs[1].h;

    float step_w = step_width;
    float step_h = step_height;
    if (step_w == -233)
    {
        step_w = (float)image_w / w;
        if (step_mmdetection)
            step_w = static_cast<float>(ceil((float)image_w / w));
    }
    if (step_h == -233)
    {
        step_h = (float)image_h / h;
        if (step_mmdetection)
            step_h = static_cast<float>(ceil((float)image_h / h));
    }

    int num_min_size = min_sizes.w;
    int num_max_size = max_sizes.w;
    int num_aspect_ratio = aspect_ratios.w;

    int num_prior = num_min_size * num_aspect_ratio + num_min_size + num_max_size;
    if (flip)
        num_prior += num_min_size * num_aspect_ratio;

    Mat& top_blob = top_blobs[0];
    top_blob.create(4 * w * h * num_prior, 2, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < h; i++)
    {
        float* box = (float*)top_blob + i * w * num_prior * 4;

        float center_x = offset * step_w;
        float center_y = offset * step_h + i * step_h;
        if (center_mmdetection) 
        {
            center_x = offset * (step_w - 1);
            center_y = offset * (step_h - 1) + i * step_h;
        }

        for (int j = 0; j < w; j++)
        {
            float box_w;
            float box_h;

            for (int k = 0; k < num_min_size; k++)
            {
                float min_size = min_sizes[k];

                // min size box
                box_w = box_h = min_size;

                box[0] = (center_x - box_w * 0.5f) / image_w;
                box[1] = (center_y - box_h * 0.5f) / image_h;
                box[2] = (center_x + box_w * 0.5f) / image_w;
                box[3] = (center_y + box_h * 0.5f) / image_h;

                box += 4;

                if (num_max_size > 0)
                {
                    float max_size = max_sizes[k];

                    // max size box
                    box_w = box_h = static_cast<float>(sqrt(min_size * max_size));

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;
                }

                // all aspect_ratios
                for (int p = 0; p < num_aspect_ratio; p++)
                {
                    float ar = aspect_ratios[p];

                    box_w = static_cast<float>(min_size * sqrt(ar));
                    box_h = static_cast<float>(min_size / sqrt(ar));

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;

                    if (flip)
                    {
                        box[0] = (center_x - box_h * 0.5f) / image_w;
                        box[1] = (center_y - box_w * 0.5f) / image_h;
                        box[2] = (center_x + box_h * 0.5f) / image_w;
                        box[3] = (center_y + box_w * 0.5f) / image_h;

                        box += 4;
                    }
                }
            }

            center_x += step_w;
        }
    }

    if (clip)
    {
        float* box = top_blob;
        for (int i = 0; i < top_blob.w; i++)
        {
            box[i] = std::min(std::max(box[i], 0.f), 1.f);
        }
    }

    // set variance
    float* var = top_blob.row(1);
    for (int i = 0; i < top_blob.w / 4; i++)
    {
        var[0] = variances[0];
        var[1] = variances[1];
        var[2] = variances[2];
        var[3] = variances[3];

        var += 4;
    }

    return 0;
}